

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O1

QString * toStringTextDate(QString *__return_storage_ptr__,QDate date)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  int day;
  longlong __old_val;
  long in_FS_OFFSET;
  bool bVar4;
  YearMonthDay YVar5;
  QCalendar cal;
  QArrayData *local_178;
  char16_t *pcStack_170;
  qsizetype local_168;
  QLocale local_160;
  QString local_158;
  QLocale local_140;
  QString local_138;
  QStringBuilder<QStringBuilder<QString,_const_QLatin1Char_&>,_QString> local_120;
  QStringBuilder<QStringBuilder<QString,_const_QLatin1Char_&>,_QString> local_e8;
  QLatin1Char *pQStack_b0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QLatin1Char_&>,_QString>,_const_QLatin1Char_&>,_QString>
  local_a8;
  QLatin1Char local_41;
  QCalendar local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (date.jd + 0xb69eeff91fU < 0x16d3e147974) {
    local_40.d_ptr = (QCalendarBackend *)&DAT_aaaaaaaaaaaaaaaa;
    QCalendar::QCalendar(&local_40);
    YVar5 = QCalendar::partsFromDate(&local_40,date);
    bVar4 = YVar5._0_8_ >> 0x20 != 0x80000000;
    if (bVar4) {
      local_41.ch = ' ';
      QLocale::QLocale(&local_140,C,AnyScript,AnyCountry);
      day = QCalendar::dayOfWeek(&local_40,date);
      QLocale::dayName(&local_138,&local_140,day,ShortFormat);
      qVar3 = local_138.d.size;
      pcVar2 = local_138.d.ptr;
      pDVar1 = local_138.d.d;
      local_138.d.d = (Data *)0x0;
      local_138.d.ptr = (char16_t *)0x0;
      local_138.d.size = 0;
      QLocale::QLocale(&local_160,C,AnyScript,AnyCountry);
      QCalendar::monthName(&local_158,&local_40,&local_160,YVar5.month,YVar5.year,ShortFormat);
      local_e8.b.d.size = local_158.d.size;
      local_e8.b.d.ptr = local_158.d.ptr;
      local_e8.b.d.d = local_158.d.d;
      local_120.a.b = &local_41;
      local_158.d.d = (Data *)0x0;
      local_158.d.ptr = (char16_t *)0x0;
      local_158.d.size = 0;
      local_120.a.a.d.d = (Data *)0x0;
      local_e8.a.a.d.d = pDVar1;
      local_120.a.a.d.ptr = (char16_t *)0x0;
      local_120.a.a.d.size = 0;
      local_e8.a.a.d.ptr = pcVar2;
      local_e8.a.a.d.size = qVar3;
      local_120.b.d.d = (Data *)0x0;
      local_120.b.d.ptr = (char16_t *)0x0;
      local_120.b.d.size = 0;
      local_e8.a.b = local_120.a.b;
      pQStack_b0 = local_120.a.b;
      QString::asprintf((char **)&local_178,"%d %04d",(ulong)(uint)YVar5.day);
      local_a8.a.a.b.d.size = local_e8.b.d.size;
      local_a8.a.a.b.d.ptr = local_e8.b.d.ptr;
      local_a8.a.a.b.d.d = local_e8.b.d.d;
      local_a8.a.a.a.a.d.size = local_e8.a.a.d.size;
      local_a8.a.a.a.a.d.ptr = local_e8.a.a.d.ptr;
      local_a8.a.a.a.a.d.d = local_e8.a.a.d.d;
      local_a8.b.d.size = local_168;
      local_a8.b.d.ptr = pcStack_170;
      local_a8.b.d.d = (Data *)local_178;
      local_e8.a.a.d.d = (Data *)0x0;
      local_e8.a.a.d.ptr = (char16_t *)0x0;
      local_e8.a.a.d.size = 0;
      local_e8.b.d.d = (Data *)0x0;
      local_a8.a.a.a.b = local_e8.a.b;
      local_e8.b.d.ptr = (char16_t *)0x0;
      local_e8.b.d.size = 0;
      local_a8.a.b = pQStack_b0;
      local_178 = (QArrayData *)0x0;
      pcStack_170 = (char16_t *)0x0;
      local_168 = 0;
      QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QLatin1Char_&>,_QString>,_const_QLatin1Char_&>,_QString>
      ::convertTo<QString>(__return_storage_ptr__,&local_a8);
      QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QLatin1Char_&>,_QString>,_const_QLatin1Char_&>,_QString>
      ::~QStringBuilder(&local_a8);
      if (local_178 != (QArrayData *)0x0) {
        LOCK();
        (local_178->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_178->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_178->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_178,2,0x10);
        }
      }
      QStringBuilder<QStringBuilder<QString,_const_QLatin1Char_&>,_QString>::~QStringBuilder
                (&local_e8);
      QStringBuilder<QStringBuilder<QString,_const_QLatin1Char_&>,_QString>::~QStringBuilder
                (&local_120);
      if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,2,0x10);
        }
      }
      QLocale::~QLocale(&local_160);
      if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,0x10);
        }
      }
      QLocale::~QLocale(&local_140);
      if (bVar4) goto LAB_0034d19f;
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
LAB_0034d19f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QString toStringTextDate(QDate date)
{
    if (date.isValid()) {
        QCalendar cal; // Always Gregorian
        const auto parts = cal.partsFromDate(date);
        if (parts.isValid()) {
            const QLatin1Char sp(' ');
            return QLocale::c().dayName(cal.dayOfWeek(date), QLocale::ShortFormat) + sp
                + cal.monthName(QLocale::c(), parts.month, parts.year, QLocale::ShortFormat)
                // Documented to use 4-digit year
                + sp + QString::asprintf("%d %04d", parts.day, parts.year);
        }
    }
    return QString();
}